

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

int __thiscall TPZSkylMatrix<double>::Decompose_LDLt(TPZSkylMatrix<double> *this)

{
  double dVar1;
  long lVar2;
  bool bVar3;
  double **ppdVar4;
  double *pdVar5;
  int64_t iVar6;
  int64_t iVar7;
  ostream *poVar8;
  void *this_00;
  long *in_RDI;
  double *diagptr;
  int64_t k;
  double sum;
  TPZVec<double> diag;
  int64_t dimension;
  int64_t minrow;
  int64_t minl;
  int64_t minj;
  int64_t l;
  int64_t j;
  double *ell;
  double *elj;
  int64_t in_stack_fffffffffffffec8;
  TPZVec<double> *in_stack_fffffffffffffed0;
  ostream *in_stack_fffffffffffffed8;
  TPZSkylMatrix<double> *in_stack_fffffffffffffee0;
  int64_t local_e0;
  double *local_98;
  int64_t local_90;
  double local_88;
  TPZVec<double> local_70;
  long local_50;
  int64_t local_48;
  long local_40;
  long local_38;
  long local_30;
  int64_t local_28;
  double *local_20;
  double *local_18;
  int local_4;
  
  if ((char)in_RDI[3] == '\x04') {
    local_4 = 1;
  }
  else {
    if ((char)in_RDI[3] != '\0') {
      TPZMatrix<double>::Error((char *)diag.fStore,(char *)diag._vptr_TPZVec);
    }
    local_50 = (**(code **)(*in_RDI + 0x60))();
    TPZVec<double>::TPZVec(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    for (local_28 = 0; local_28 < local_50; local_28 = local_28 + 1) {
      ppdVar4 = TPZVec<double_*>::operator[]((TPZVec<double_*> *)(in_RDI + 4),local_28);
      dVar1 = **ppdVar4;
      pdVar5 = TPZVec<double>::operator[](&local_70,local_28);
      *pdVar5 = dVar1;
    }
    for (local_28 = 1; iVar7 = local_28, local_28 < local_50; local_28 = local_28 + 1) {
      iVar6 = Size(in_stack_fffffffffffffee0,(int64_t)in_stack_fffffffffffffed8);
      local_38 = (iVar7 - iVar6) + 1;
      for (local_30 = local_38; lVar2 = local_30, local_30 <= local_28; local_30 = local_30 + 1) {
        iVar7 = Size(in_stack_fffffffffffffee0,(int64_t)in_stack_fffffffffffffed8);
        local_40 = (lVar2 - iVar7) + 1;
        local_e0 = local_40;
        if (local_40 <= local_38) {
          local_e0 = local_38;
        }
        local_48 = local_e0;
        local_90 = local_e0;
        ppdVar4 = TPZVec<double_*>::operator[]((TPZVec<double_*> *)(in_RDI + 4),local_28);
        local_18 = *ppdVar4 + (local_28 - local_48);
        ppdVar4 = TPZVec<double_*>::operator[]((TPZVec<double_*> *)(in_RDI + 4),local_30);
        local_20 = *ppdVar4 + (local_30 - local_48);
        local_98 = TPZVec<double>::operator[](&local_70,local_e0);
        local_88 = 0.0;
        for (; local_90 < local_30; local_90 = local_90 + 1) {
          local_88 = *local_18 * *local_20 * *local_98 + local_88;
          local_98 = local_98 + 1;
          local_20 = local_20 + -1;
          local_18 = local_18 + -1;
        }
        *local_18 = *local_18 - local_88;
        if (local_20 == local_18) {
          bVar3 = IsZero(*local_18);
          if (bVar3) {
            *local_98 = *local_18;
            poVar8 = std::operator<<((ostream *)&std::cout,"TPZSkylMatrix pivot = ");
            this_00 = (void *)std::ostream::operator<<(poVar8,*local_18);
            std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
            std::operator<<((ostream *)&std::cout,"TPZSkylMatrix::DecomposeLDLt zero pivot\n");
            poVar8 = std::operator<<((ostream *)&std::cout,"j = ");
            in_stack_fffffffffffffee0 =
                 (TPZSkylMatrix<double> *)std::ostream::operator<<(poVar8,local_28);
            in_stack_fffffffffffffed8 =
                 std::operator<<((ostream *)in_stack_fffffffffffffee0," l = ");
            in_stack_fffffffffffffed0 =
                 (TPZVec<double> *)std::ostream::operator<<(in_stack_fffffffffffffed8,local_30);
            std::ostream::operator<<
                      (in_stack_fffffffffffffed0,std::endl<char,std::char_traits<char>>);
          }
          else {
            *local_98 = *local_18;
          }
        }
        else {
          *local_18 = *local_18 / *local_20;
        }
      }
    }
    *(undefined1 *)(in_RDI + 3) = 4;
    *(undefined1 *)((long)in_RDI + 0x19) = 0;
    local_4 = 1;
    TPZVec<double>::~TPZVec(in_stack_fffffffffffffed0);
  }
  return local_4;
}

Assistant:

int
TPZSkylMatrix<TVar>::Decompose_LDLt()
{
    
    if( this->fDecomposed == ELDLt) return 1;
    if (  this->fDecomposed )
        TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__, "Decompose_LDLt <Matrix already Decomposed with different decomposition>" );
    
#ifdef DUMP_BEFORE_DECOMPOSE
    dump_matrix(this, "TPZSkylMatrix::Decompose_LDLt()");
#endif
    
    // Third try
    TVar *elj,*ell;
    int64_t j,l,minj,minl,minrow,dimension = this->Dim();
    TPZVec<TVar> diag(dimension);
    for(j=0; j<dimension; j++)
    {
        diag[j] = *fElem[j];
    }
    
    //std::cout << "TPZSkylMatrix<TVar>::Decompose_LDLt: dimension = " << dimension  << std::endl;
    
    TVar sum;
    j = 1;
    while(j < dimension) {
        /*    if(!(j%100) && Dim() > 100) {
         cout <<  j << ' ';
         cout.flush();
         }
         if(!(j%1000)) cout << endl;*/
        minj = j-Size(j)+1;
        l = minj;
        while(l <= j) {
            minl = l-Size(l)+1;
            minrow = (minj<minl)? minl:minj;
            int64_t k = minrow;
            //			DiagkPtr = fDiag+minrow;
            elj = fElem[j]+j-minrow;
            ell = fElem[l]+l-minrow;
            TVar *diagptr = &diag[k];
            sum = 0.;
            while(k < l) {
                //		  sum += *elj-- * *ell-- * *(fElem[k++]);
                //EBORIN: trocar *diagptr++ por *diagptr-- ajuda na vetorização?
                if constexpr(is_complex<TVar>::value){
                    sum += (*elj--) * std::conj(*ell--) * (*diagptr++);
                }else{
                    sum += (*elj--) * (*ell--) * (*diagptr++);
                }
                k++;
            }
            *elj -= sum;
            if(ell != elj) *elj /= *ell;
            else if(IsZero(*elj)) {
#ifdef PZ_LOG
                std::stringstream sout;
                sout << "col = " << j << " diagonal " << *elj;
                LOGPZ_DEBUG(logger,sout.str())
#endif
                
                *diagptr = *elj;
                cout << "TPZSkylMatrix pivot = " << *elj << endl;
                cout << "TPZSkylMatrix::DecomposeLDLt zero pivot\n";
                cout << "j = " << j << " l = " << l << endl;
            }
            else
            {
                *diagptr = *elj;
            }
            l++;
        }
        j++;
    }
    this->fDecomposed  = ELDLt;
    this->fDefPositive = 0;
    //if(Dim() > 100) cout << endl;
    return( 1 );
}